

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_check_date(ly_ctx *ctx,char *date)

{
  ushort **ppuVar1;
  char *pcVar2;
  char *r;
  tm tm_;
  tm tm;
  int i;
  char *date_local;
  ly_ctx *ctx_local;
  
  if (date == (char *)0x0) {
    __assert_fail("date",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x989,"int lyp_check_date(struct ly_ctx *, const char *)");
  }
  for (tm.tm_zone._4_4_ = 0; tm.tm_zone._4_4_ < 10; tm.tm_zone._4_4_ = tm.tm_zone._4_4_ + 1) {
    if ((tm.tm_zone._4_4_ == 4) || (tm.tm_zone._4_4_ == 7)) {
      if (date[tm.tm_zone._4_4_] != '-') goto LAB_00137b2e;
    }
    else {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)date[tm.tm_zone._4_4_]] & 0x800) == 0) goto LAB_00137b2e;
    }
  }
  memset(&tm_.tm_zone,0,0x38);
  pcVar2 = strptime(date,"%Y-%m-%d",(tm *)&tm_.tm_zone);
  if ((pcVar2 != (char *)0x0) && (pcVar2 == date + 10)) {
    memcpy(&r,&tm_.tm_zone,0x38);
    mktime((tm *)&r);
    if (tm.tm_min == tm_.tm_min) {
      return 0;
    }
  }
LAB_00137b2e:
  ly_vlog(ctx,LYE_INDATE,LY_VLOG_NONE,(void *)0x0,date);
  return 1;
}

Assistant:

int
lyp_check_date(struct ly_ctx *ctx, const char *date)
{
    int i;
    struct tm tm, tm_;
    char *r;

    assert(date);

    /* check format */
    for (i = 0; i < LY_REV_SIZE - 1; i++) {
        if (i == 4 || i == 7) {
            if (date[i] != '-') {
                goto error;
            }
        } else if (!isdigit(date[i])) {
            goto error;
        }
    }

    /* check content, e.g. 2018-02-31 */
    memset(&tm, 0, sizeof tm);
    r = strptime(date, "%Y-%m-%d", &tm);
    if (!r || r != &date[LY_REV_SIZE - 1]) {
        goto error;
    }
    /* set some arbitrary non-0 value in case DST changes, it could move the day otherwise */
    tm.tm_hour = 12;

    memcpy(&tm_, &tm, sizeof tm);
    mktime(&tm_); /* mktime modifies tm_ if it refers invalid date */
    if (tm.tm_mday != tm_.tm_mday) { /* e.g 2018-02-29 -> 2018-03-01 */
        /* checking days is enough, since other errors
         * have been checked by strptime() */
        goto error;
    }

    return EXIT_SUCCESS;

error:
    LOGVAL(ctx, LYE_INDATE, LY_VLOG_NONE, NULL, date);
    return EXIT_FAILURE;
}